

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coding.cc
# Opt level: O0

void leveldb::PutLengthPrefixedSlice(string *dst,Slice *value)

{
  size_t sVar1;
  char *pcVar2;
  Slice *value_local;
  string *dst_local;
  
  sVar1 = Slice::size(value);
  PutVarint32(dst,(uint32_t)sVar1);
  pcVar2 = Slice::data(value);
  Slice::size(value);
  std::__cxx11::string::append((char *)dst,(ulong)pcVar2);
  return;
}

Assistant:

void PutLengthPrefixedSlice(std::string *dst, const Slice &value) {
        PutVarint32(dst, value.size());
        dst->append(value.data(), value.size());
    }